

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.cpp
# Opt level: O1

int luaD_poscall(lua_State *L,StkId firstResult)

{
  int *piVar1;
  StkId pTVar2;
  int iVar3;
  CallInfo *pCVar4;
  int iVar5;
  StkId pTVar6;
  TValue *o2;
  
  if ((L->hookmask & 2) != 0) {
    pTVar6 = L->stack;
    luaD_callhook(L,1,-1);
    if ((((L->ci->func->value).gc)->h).flags == '\0') {
      while ((L->hookmask & 2) != 0) {
        piVar1 = &L->ci->tailcalls;
        iVar3 = *piVar1;
        *piVar1 = *piVar1 + -1;
        if (iVar3 == 0) break;
        luaD_callhook(L,4,-1);
      }
    }
    firstResult = (StkId)(((long)firstResult - (long)pTVar6) + (long)L->stack);
  }
  pCVar4 = L->ci;
  L->ci = pCVar4 + -1;
  pTVar6 = pCVar4->func;
  iVar3 = pCVar4->nresults;
  L->base = pCVar4[-1].base;
  L->savedpc = pCVar4[-1].savedpc;
  iVar5 = iVar3;
  if (iVar3 != 0) {
    do {
      if (L->top <= firstResult) goto LAB_0010ad44;
      pTVar2 = pTVar6 + 1;
      pTVar6->value = firstResult->value;
      pTVar6->tt = firstResult->tt;
      firstResult = firstResult + 1;
      iVar5 = iVar5 + -1;
      pTVar6 = pTVar2;
    } while (iVar5 != 0);
    iVar5 = 0;
  }
LAB_0010ad44:
  if (0 < iVar5) {
    iVar5 = iVar5 + 1;
    do {
      pTVar6->tt = 0;
      pTVar6 = pTVar6 + 1;
      iVar5 = iVar5 + -1;
    } while (1 < iVar5);
  }
  L->top = pTVar6;
  return iVar3 + 1;
}

Assistant:

int luaD_poscall (lua_State *L, StkId firstResult) {
  StkId res;
  int wanted, i;
  CallInfo *ci;
  if (L->hookmask & LUA_MASKRET)
    firstResult = callrethooks(L, firstResult);
  ci = L->ci--;
  res = ci->func;  /* res == final position of 1st result */
  wanted = ci->nresults;
  L->base = (ci - 1)->base;  /* restore base */
  L->savedpc = (ci - 1)->savedpc;  /* restore savedpc */
  /* move results to correct place */
  for (i = wanted; i != 0 && firstResult < L->top; i--)
    setobjs2s(L, res++, firstResult++);
  while (i-- > 0)
    setnilvalue(res++);
  L->top = res;
  return (wanted - LUA_MULTRET);  /* 0 iff wanted == LUA_MULTRET */
}